

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

aom_codec_err_t
av1_firstpass_info_init
          (FIRSTPASS_INFO *firstpass_info,FIRSTPASS_STATS *ext_stats_buf,int ext_stats_buf_size)

{
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int i;
  FIRSTPASS_STATS *in_stack_ffffffffffffffd8;
  int iVar1;
  undefined4 local_4;
  
  if (in_RSI == 0) {
    *(long *)(in_RDI + 0x2c68) = in_RDI;
    *(undefined4 *)(in_RDI + 0x2c70) = 0x31;
    *(undefined4 *)(in_RDI + 0x2c74) = 0;
    *(undefined4 *)(in_RDI + 0x2c7c) = 0;
    *(undefined4 *)(in_RDI + 0x2c78) = 0;
    *(undefined4 *)(in_RDI + 0x2c80) = 0;
    *(undefined4 *)(in_RDI + 0x2c84) = 0;
    memset((void *)(in_RDI + 0x2c88),0,0xe8);
    if (in_EDX == 0) {
      local_4 = AOM_CODEC_OK;
    }
    else {
      local_4 = AOM_CODEC_ERROR;
    }
  }
  else {
    *(long *)(in_RDI + 0x2c68) = in_RSI;
    *(int *)(in_RDI + 0x2c70) = in_EDX;
    *(undefined4 *)(in_RDI + 0x2c74) = 0;
    *(undefined4 *)(in_RDI + 0x2c7c) = 0;
    *(undefined4 *)(in_RDI + 0x2c78) = *(undefined4 *)(in_RDI + 0x2c70);
    *(undefined4 *)(in_RDI + 0x2c80) = *(undefined4 *)(in_RDI + 0x2c78);
    *(undefined4 *)(in_RDI + 0x2c84) = 0;
    memset((void *)(in_RDI + 0x2c88),0,0xe8);
    for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x2c78); iVar1 = iVar1 + 1) {
      av1_accumulate_stats((FIRSTPASS_STATS *)CONCAT44(in_EDX,iVar1),in_stack_ffffffffffffffd8);
    }
    local_4 = AOM_CODEC_OK;
  }
  return local_4;
}

Assistant:

aom_codec_err_t av1_firstpass_info_init(FIRSTPASS_INFO *firstpass_info,
                                        FIRSTPASS_STATS *ext_stats_buf,
                                        int ext_stats_buf_size) {
  assert(IMPLIES(ext_stats_buf == NULL, ext_stats_buf_size == 0));
  if (ext_stats_buf == NULL) {
    firstpass_info->stats_buf = firstpass_info->static_stats_buf;
    firstpass_info->stats_buf_size =
        sizeof(firstpass_info->static_stats_buf) /
        sizeof(firstpass_info->static_stats_buf[0]);
    firstpass_info->start_index = 0;
    firstpass_info->cur_index = 0;
    firstpass_info->stats_count = 0;
    firstpass_info->future_stats_count = 0;
    firstpass_info->past_stats_count = 0;
    av1_zero(firstpass_info->total_stats);
    if (ext_stats_buf_size == 0) {
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  } else {
    firstpass_info->stats_buf = ext_stats_buf;
    firstpass_info->stats_buf_size = ext_stats_buf_size;
    firstpass_info->start_index = 0;
    firstpass_info->cur_index = 0;
    firstpass_info->stats_count = firstpass_info->stats_buf_size;
    firstpass_info->future_stats_count = firstpass_info->stats_count;
    firstpass_info->past_stats_count = 0;
    av1_zero(firstpass_info->total_stats);
    for (int i = 0; i < firstpass_info->stats_count; ++i) {
      av1_accumulate_stats(&firstpass_info->total_stats,
                           &firstpass_info->stats_buf[i]);
    }
  }
  return AOM_CODEC_OK;
}